

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_pstream.c
# Opt level: O0

void HTS_PStream_mlpg(HTS_PStream *pst)

{
  HTS_PStream *in_RDI;
  size_t m;
  ulong local_10;
  
  if (in_RDI->length != 0) {
    for (local_10 = 0; local_10 < in_RDI->vector_length; local_10 = local_10 + 1) {
      HTS_PStream_calc_wuw_and_wum(in_RDI,local_10);
      HTS_PStream_ldl_factorization(in_RDI);
      HTS_PStream_forward_substitution(in_RDI);
      HTS_PStream_backward_substitution(in_RDI,local_10);
      if (in_RDI->gv_length != 0) {
        HTS_PStream_gv_parmgen(pst,m);
      }
    }
  }
  return;
}

Assistant:

static void HTS_PStream_mlpg(HTS_PStream * pst)
{
   size_t m;

   if (pst->length == 0)
      return;

   for (m = 0; m < pst->vector_length; m++) {
      HTS_PStream_calc_wuw_and_wum(pst, m);
      HTS_PStream_ldl_factorization(pst);       /* LDL factorization */
      HTS_PStream_forward_substitution(pst);    /* forward substitution   */
      HTS_PStream_backward_substitution(pst, m);        /* backward substitution  */
      if (pst->gv_length > 0)
         HTS_PStream_gv_parmgen(pst, m);
   }
}